

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CENamespace.cpp
# Opt level: O3

string * __thiscall
CppEphem::StrOpt::join<std::__cxx11::string>
          (string *__return_storage_ptr__,StrOpt *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values,char *delim)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  size_type sVar4;
  ostringstream ss;
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this);
  if (sVar1 != 0) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this,0);
    std::operator<<((ostream *)aoStack_1a8,(string *)pvVar2);
  }
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this);
  if (1 < sVar1) {
    sVar1 = 1;
    do {
      poVar3 = std::operator<<((ostream *)aoStack_1a8,
                               *(char *)&(values->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this,sVar1);
      std::operator<<(poVar3,(string *)pvVar2);
      sVar1 = sVar1 + 1;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this);
    } while (sVar1 < sVar4);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string CppEphem::StrOpt::join(const std::vector<T>& values,
                                   const char&           delim)
{
    // Assemble the first value in the string
    std::ostringstream ss;
    if (values.size() > 0) {
        ss << values[0];
    }

    // Now append the rest
    for (int i=1; i<values.size(); i++) { 
        ss << delim << values[i];
    }

    return ss.str();
}